

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void dtdDestroy(DTD *p,XML_Parser parser)

{
  NAMED *pNVar1;
  ELEMENT_TYPE *e;
  HASH_TABLE_ITER iter;
  XML_Parser parser_local;
  DTD *p_local;
  
  iter.end = (NAMED **)parser;
  hashTableIterInit((HASH_TABLE_ITER *)&e,&p->elementTypes);
  while (pNVar1 = hashTableIterNext((HASH_TABLE_ITER *)&e), pNVar1 != (NAMED *)0x0) {
    if (*(int *)((long)&pNVar1[3].name + 4) != 0) {
      (*(code *)iter.end[5])(pNVar1[4].name);
    }
  }
  hashTableDestroy(&p->generalEntities);
  hashTableDestroy(&p->paramEntities);
  hashTableDestroy(&p->elementTypes);
  hashTableDestroy(&p->attributeIds);
  hashTableDestroy(&p->prefixes);
  poolDestroy(&p->pool);
  if (p->scaffIndex != (int *)0x0) {
    (*(code *)iter.end[5])(p->scaffIndex);
  }
  if (p->scaffold != (CONTENT_SCAFFOLD *)0x0) {
    (*(code *)iter.end[5])(p->scaffold);
  }
  return;
}

Assistant:

static void dtdDestroy(DTD *p, XML_Parser parser)
{
  HASH_TABLE_ITER iter;
  hashTableIterInit(&iter, &(p->elementTypes));
  for (;;) {
    ELEMENT_TYPE *e = (ELEMENT_TYPE *)hashTableIterNext(&iter);
    if (!e)
      break;
    if (e->allocDefaultAtts != 0)
      FREE(e->defaultAtts);
  }
  hashTableDestroy(&(p->generalEntities));
#ifdef XML_DTD
  hashTableDestroy(&(p->paramEntities));
#endif /* XML_DTD */
  hashTableDestroy(&(p->elementTypes));
  hashTableDestroy(&(p->attributeIds));
  hashTableDestroy(&(p->prefixes));
  poolDestroy(&(p->pool));
  if (p->scaffIndex)
    FREE(p->scaffIndex);
  if (p->scaffold)
    FREE(p->scaffold);
}